

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_x11_req_ex
              (LIBSSH2_CHANNEL *channel,int single_connection,char *auth_proto,char *auth_cookie,
              int screen_number)

{
  uchar uVar1;
  LIBSSH2_SESSION *session;
  int iVar2;
  size_t len;
  size_t __n;
  uchar *puVar3;
  char *errmsg;
  byte *buf;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  uchar *s;
  uint32_t local_84;
  uchar *local_80;
  char *local_78;
  char *local_70;
  packet_requirev_state_t *local_68;
  time_t local_60;
  char *local_58;
  uchar *local_50;
  uchar buffer [17];
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar2 = -0x27;
  }
  else {
    local_60 = time((time_t *)0x0);
    local_70 = "MIT-MAGIC-COOKIE-1";
    if (auth_proto != (char *)0x0) {
      local_70 = auth_proto;
    }
    local_80 = channel->reqX11_local_channel;
    local_68 = &channel->reqX11_packet_requirev_state;
    local_84 = screen_number;
    local_58 = auth_proto;
    do {
      session = channel->session;
      if (local_58 == (char *)0x0) {
        len = 0x12;
      }
      else {
        len = strlen(local_58);
      }
      if (auth_cookie == (char *)0x0) {
        __n = 0x20;
      }
      else {
        __n = strlen(auth_cookie);
      }
      if (channel->reqX11_state == libssh2_NB_state_idle) {
        sVar4 = len + __n + 0x1e;
        channel->reqX11_packet_len = sVar4;
        (channel->reqX11_packet_requirev_state).start = 0;
        puVar3 = (uchar *)(*session->alloc)(sVar4,&session->abstract);
        channel->reqX11_packet = puVar3;
        if (puVar3 != (uchar *)0x0) {
          s = puVar3 + 1;
          *puVar3 = 'b';
          _libssh2_store_u32(&s,(channel->remote).id);
          _libssh2_store_str(&s,"x11-req",7);
          puVar3 = s + 1;
          *s = '\x01';
          s = s + 2;
          *puVar3 = single_connection != 0;
          _libssh2_store_str(&s,local_70,len);
          _libssh2_store_u32(&s,(uint32_t)__n);
          if (auth_cookie == (char *)0x0) {
            buf = buffer;
            local_78 = auth_cookie;
            RAND_bytes(buf,0x10);
            lVar5 = 0;
            do {
              sprintf((char *)(s + lVar5),"%02X",(ulong)*buf);
              lVar5 = lVar5 + 2;
              buf = buf + 1;
              auth_cookie = local_78;
            } while (lVar5 != 0x20);
          }
          else {
            memcpy(s,auth_cookie,__n);
          }
          s = s + __n;
          _libssh2_store_u32(&s,local_84);
          channel->reqX11_state = libssh2_NB_state_created;
          goto LAB_001147d2;
        }
        iVar2 = -6;
        errmsg = "Unable to allocate memory for pty-request";
        s = (uchar *)0x0;
LAB_00114939:
        iVar2 = _libssh2_error(session,iVar2,errmsg);
      }
      else {
LAB_001147d2:
        if (channel->reqX11_state != libssh2_NB_state_created) {
LAB_00114861:
          if (channel->reqX11_state == libssh2_NB_state_sent) {
            iVar2 = _libssh2_packet_requirev
                              (session,"cd",&local_50,(size_t *)buffer,1,local_80,4,local_68);
            if (iVar2 == -0x25) {
LAB_00114924:
              bVar6 = false;
            }
            else {
              if (iVar2 != 0) {
                channel->reqX11_state = libssh2_NB_state_idle;
                iVar2 = _libssh2_error(session,iVar2,"waiting for x11-req response packet");
                goto LAB_00114924;
              }
              uVar1 = *local_50;
              (*session->free)(local_50,&session->abstract);
              channel->reqX11_state = libssh2_NB_state_idle;
              bVar6 = uVar1 != 'c';
              iVar2 = 0;
            }
            if (!bVar6) goto LAB_00114941;
          }
          iVar2 = -0x16;
          errmsg = "Unable to complete request for channel x11-req";
          goto LAB_00114939;
        }
        iVar2 = _libssh2_transport_send
                          (session,channel->reqX11_packet,channel->reqX11_packet_len,(uchar *)0x0,0)
        ;
        if (iVar2 == 0) {
          (*session->free)(channel->reqX11_packet,&session->abstract);
          channel->reqX11_packet = (uchar *)0x0;
          _libssh2_htonu32(local_80,(channel->local).id);
          channel->reqX11_state = libssh2_NB_state_sent;
          goto LAB_00114861;
        }
        if (iVar2 != -0x25) {
          (*session->free)(channel->reqX11_packet,&session->abstract);
          channel->reqX11_packet = (uchar *)0x0;
          channel->reqX11_state = libssh2_NB_state_idle;
          errmsg = "Unable to send x11-req packet";
          goto LAB_00114939;
        }
        iVar2 = -0x25;
        _libssh2_error(session,-0x25,"Would block sending X11-req packet");
      }
LAB_00114941:
      if (iVar2 != -0x25) {
        return iVar2;
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(channel->session,local_60);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_channel_x11_req_ex(LIBSSH2_CHANNEL *channel, int single_connection,
                           const char *auth_proto, const char *auth_cookie,
                           int screen_number)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_x11_req(channel, single_connection, auth_proto,
                                 auth_cookie, screen_number));
    return rc;
}